

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall
QAbstractSpinBox::setButtonSymbols(QAbstractSpinBox *this,ButtonSymbols buttonSymbols)

{
  long *plVar1;
  
  plVar1 = *(long **)(this + 8);
  if (*(ButtonSymbols *)(plVar1 + 0x78) == buttonSymbols) {
    return;
  }
  *(ButtonSymbols *)(plVar1 + 0x78) = buttonSymbols;
  (**(code **)(*plVar1 + 0x100))();
  QWidget::updateGeometry((QWidget *)this);
  QWidget::update((QWidget *)this);
  return;
}

Assistant:

void QAbstractSpinBox::setButtonSymbols(ButtonSymbols buttonSymbols)
{
    Q_D(QAbstractSpinBox);
    if (d->buttonSymbols != buttonSymbols) {
        d->buttonSymbols = buttonSymbols;
        d->updateEditFieldGeometry();
        updateGeometry();
        update();
    }
}